

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNDstrBase::adjust_for_dyn(CTPNDstrBase *this,tcpn_dyncomp_info *info)

{
  CTPNDebugDstr *this_00;
  
  if (info->speculative == 0) {
    this_00 = (CTPNDebugDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)info);
    CTPNDebugDstr::CTPNDebugDstr(this_00,this->str_,this->len_);
    return (CTcPrsNode *)this_00;
  }
  err_throw(0x9c5);
}

Assistant:

CTcPrsNode *CTPNDstrBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* 
     *   don't allow dstring evaluation in speculative mode, since we
     *   can't execute anything with side effects in this mode 
     */
    if (info->speculative)
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* return a debugger dstring node */
    return new CTPNDebugDstr(str_, len_);
}